

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QTransform * __thiscall
QGraphicsView::viewportTransform(QTransform *__return_storage_ptr__,QGraphicsView *this)

{
  QGraphicsViewPrivate *this_00;
  long lVar1;
  qreal *pqVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  byte bVar6;
  qreal local_70 [10];
  long local_20;
  
  bVar6 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  if ((this_00->field_0x300 & 0x20) == 0) {
    qVar5 = this_00->scrollX;
  }
  else {
    QGraphicsViewPrivate::updateScroll(this_00);
    qVar5 = this_00->scrollX;
    if ((this_00->field_0x300 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
    }
  }
  pqVar2 = (qreal *)&DAT_006f5c10;
  pqVar3 = local_70;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pqVar3 = *pqVar2;
    pqVar2 = pqVar2 + (ulong)bVar6 * -2 + 1;
    pqVar3 = pqVar3 + (ulong)bVar6 * -2 + 1;
  }
  QTransform::fromTranslate((double)-qVar5,(double)-this_00->scrollY);
  if ((this_00->field_0x300 & 0x10) == 0) {
    QTransform::operator*(__return_storage_ptr__,&this_00->matrix);
  }
  else {
    pqVar2 = local_70;
    pQVar4 = __return_storage_ptr__;
    for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pQVar4->m_matrix[0][0] = *pqVar2;
      pqVar2 = pqVar2 + (ulong)bVar6 * -2 + 1;
      pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsView::viewportTransform() const
{
    Q_D(const QGraphicsView);
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    return d->identityMatrix ? moveMatrix : d->matrix * moveMatrix;
}